

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O2

size_type __thiscall
packing::AssignedProtos::combinedVolume<std::__detail::_Node_iterator<unsigned_short,true,false>>
          (AssignedProtos *this,_Node_iterator<unsigned_short,_true,_false> *begin,
          _Node_iterator<unsigned_short,_true,_false> *end)

{
  _Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *this_00;
  
  this_00 = (_Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)uniqueColors(this);
  std::__detail::
  _Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::insert<std::__detail::_Node_iterator<unsigned_short,true,false>>
            (this_00,(_Node_iterator<unsigned_short,_true,_false>)
                     (begin->super__Node_iterator_base<unsigned_short,_false>)._M_cur,
             (_Node_iterator<unsigned_short,_true,_false>)
             (end->super__Node_iterator_base<unsigned_short,_false>)._M_cur);
  return *(size_type *)(this_00 + 0x18);
}

Assistant:

auto combinedVolume(Iter &&begin, Iter &&end) const {
		auto &colors = uniqueColors();
		colors.insert(std::forward<Iter>(begin), std::forward<Iter>(end));
		return colors.size();
	}